

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O0

bool CoreML::Specification::compareSequenceTypes(FeatureType *x,FeatureType *y)

{
  TypeCase TVar1;
  TypeCase TVar2;
  SequenceFeatureType *this;
  SequenceFeatureType *this_00;
  SequenceFeatureType *yp;
  SequenceFeatureType *xp;
  FeatureType *y_local;
  FeatureType *x_local;
  
  this = FeatureType::sequencetype(x);
  this_00 = FeatureType::sequencetype(y);
  TVar1 = SequenceFeatureType::Type_case(this);
  TVar2 = SequenceFeatureType::Type_case(this_00);
  return TVar1 == TVar2;
}

Assistant:

static inline bool compareSequenceTypes(const Specification::FeatureType& x,
                                                const Specification::FeatureType& y) {
            const auto& xp = x.sequencetype();
            const auto& yp = y.sequencetype();

            if (xp.Type_case() != yp.Type_case()) {
                return false;
            }

            // TODO: Compare sizes
            
            return true;
        }